

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

void __thiscall
lzstring::LZString::CompressToUint8Array
          (LZString *this,wstring *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *res)

{
  int iVar1;
  undefined8 this_00;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  reference pvVar5;
  ulong uStack_60;
  int currentValue;
  size_t i;
  value_type_conflict2 local_41;
  undefined1 local_40 [8];
  wstring compressStr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *res_local;
  wstring *input_local;
  LZString *this_local;
  
  compressStr.field_2._8_8_ = res;
  uVar2 = std::__cxx11::wstring::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)compressStr.field_2._8_8_);
    Compress((wstring *)local_40,this,input);
    this_00 = compressStr.field_2._8_8_;
    lVar3 = std::__cxx11::wstring::size();
    local_41 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,lVar3 * 2,&local_41)
    ;
    for (uStack_60 = 0; uVar2 = std::__cxx11::wstring::size(), uStack_60 < uVar2;
        uStack_60 = uStack_60 + 1) {
      piVar4 = (int *)std::__cxx11::wstring::operator[]((ulong)local_40);
      iVar1 = *piVar4;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          compressStr.field_2._8_8_,uStack_60 << 1);
      *pvVar5 = (value_type)((uint)iVar1 >> 8);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          compressStr.field_2._8_8_,uStack_60 * 2 + 1);
      *pvVar5 = (value_type)(iVar1 % 0x100);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_40);
  }
  return;
}

Assistant:

void LZString::CompressToUint8Array(const std::wstring &input, std::vector<uint8_t> &res)
{
	if (input.empty())
		return;

	res.clear();
	std::wstring compressStr = Compress(input);
	res.assign(compressStr.size() * 2, 0);
	for (size_t i = 0; i < compressStr.size(); i++)
	{
		int currentValue = (int)compressStr[i];
		res[i * 2] = (char)(currentValue >> 8);
		res[i * 2 + 1] = (char)(currentValue % 256);
	}
}